

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

void * build_pcp_msg(pcp_flow_t *flow)

{
  undefined8 uVar1;
  pcp_errno pVar2;
  uint32_t uVar3;
  pcp_server_t *server;
  char *pcVar4;
  uint8_t *sadscp_loc;
  int local_38;
  void *next_data;
  pcp_request_t *req;
  pcp_server_t *pcp_server;
  ssize_t ret;
  pcp_flow_t *flow_local;
  
  pcp_server = (pcp_server_t *)0xffffffffffffffff;
  if (flow == (pcp_flow_t *)0x0) {
    flow_local = (pcp_flow_t *)0x0;
  }
  else {
    server = get_pcp_server(flow->ctx,flow->pcp_server_indx);
    if (server == (pcp_server_t *)0x0) {
      flow_local = (pcp_flow_t *)0x0;
    }
    else {
      if (flow->pcp_msg_buffer == (char *)0x0) {
        pcVar4 = (char *)calloc(1,0x44c);
        flow->pcp_msg_buffer = pcVar4;
        if (flow->pcp_msg_buffer == (char *)0x0) {
          pcp_logger(PCP_LOGLVL_ERR,"%s","Malloc can\'t allocate enough memory for the pcp_flow.");
          return (void *)0x0;
        }
      }
      next_data = flow->pcp_msg_buffer;
      if (server->pcp_version == '\0') {
        pVar2 = build_natpmp_msg(flow);
        pcp_server = (pcp_server_t *)(long)pVar2;
      }
      else {
        *(uint8_t *)next_data = server->pcp_version;
        *(byte *)((long)next_data + 1) =
             *(byte *)((long)next_data + 1) | (flow->kd).operation & 0x7f;
        uVar3 = htonl(flow->lifetime);
        *(uint32_t *)((long)next_data + 4) = uVar3;
        uVar1 = *(undefined8 *)((long)&(flow->kd).src_ip.__in6_u + 8);
        *(undefined8 *)((long)next_data + 8) = *(undefined8 *)&(flow->kd).src_ip.__in6_u;
        *(undefined8 *)((long)next_data + 0x10) = uVar1;
        sadscp_loc = (uint8_t *)((long)next_data + 0x18);
        local_38 = (int)sadscp_loc;
        flow->pcp_msg_len = local_38 - (int)next_data;
        switch((flow->kd).operation) {
        case '\0':
          pcp_server = (pcp_server_t *)0x0;
          break;
        case '\x01':
          pVar2 = build_pcp_map(server,flow,sadscp_loc);
          pcp_server = (pcp_server_t *)(long)pVar2;
          break;
        case '\x02':
          pVar2 = build_pcp_peer(server,flow,sadscp_loc);
          pcp_server = (pcp_server_t *)(long)pVar2;
          break;
        case '\x03':
          pVar2 = build_pcp_sadscp(server,flow,sadscp_loc);
          pcp_server = (pcp_server_t *)(long)pVar2;
        }
      }
      if ((long)pcp_server < 0) {
        pcp_logger(PCP_LOGLVL_ERR,"%s","Unsupported operation.");
        free(flow->pcp_msg_buffer);
        flow->pcp_msg_buffer = (char *)0x0;
        flow->pcp_msg_len = 0;
        next_data = (void *)0x0;
      }
      flow_local = (pcp_flow_t *)next_data;
    }
  }
  return flow_local;
}

Assistant:

void *build_pcp_msg(pcp_flow_t *flow) {
    ssize_t ret = -1;
    pcp_server_t *pcp_server = NULL;
    pcp_request_t *req;
    // pointer used for referencing next data structure in linked list
    void *next_data = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!flow) {
        return NULL;
    }

    pcp_server = get_pcp_server(flow->ctx, flow->pcp_server_indx);

    if (!pcp_server) {
        return NULL;
    }

    if (!flow->pcp_msg_buffer) {
        flow->pcp_msg_buffer = (char *)calloc(1, PCP_MAX_LEN);
        if (flow->pcp_msg_buffer == NULL) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Malloc can't allocate enough memory for the pcp_flow.");
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return NULL;
        }
    }

    req = (pcp_request_t *)flow->pcp_msg_buffer;

    if (pcp_server->pcp_version == 0) {
        // NATPMP
#ifndef PCP_DISABLE_NATPMP
        ret = build_natpmp_msg(flow);
#endif
    } else {

        req->ver = pcp_server->pcp_version;

        req->r_opcode |= (uint8_t)(flow->kd.operation & 0x7f); // set  opcode
        req->req_lifetime = htonl((uint32_t)flow->lifetime);

        memcpy(&req->ip, &flow->kd.src_ip, 16);
        // next data in the packet
        next_data = req->next_data;
        flow->pcp_msg_len = (uint8_t *)next_data - (uint8_t *)req;

        switch (flow->kd.operation) {
        case PCP_OPCODE_PEER:
            ret = build_pcp_peer(pcp_server, flow, next_data);
            break;
        case PCP_OPCODE_MAP:
            ret = build_pcp_map(pcp_server, flow, next_data);
            break;
#ifdef PCP_SADSCP
        case PCP_OPCODE_SADSCP:
            ret = build_pcp_sadscp(pcp_server, flow, next_data);
            break;
#endif
        case PCP_OPCODE_ANNOUNCE:
            ret = 0;
            break;
        }
    }

    if (ret < 0) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s", "Unsupported operation.");
        free(flow->pcp_msg_buffer);
        flow->pcp_msg_buffer = NULL;
        flow->pcp_msg_len = 0;
        req = NULL;
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return req;
}